

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::evaluator<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_>::evaluator
          (evaluator<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_> *this,
          XprType *diagonal)

{
  type *m;
  char *v;
  int __c;
  XprType *diagonal_local;
  evaluator<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_> *this_local;
  
  evaluator_base<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_>::evaluator_base
            ((evaluator_base<Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>_> *)this);
  m = Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>::nestedExpression(diagonal);
  evaluator<Eigen::Matrix<float,_16,_16,_0,_16,_16>_>::evaluator(&this->m_argImpl,m);
  v = Diagonal<Eigen::Matrix<float,_16,_16,_0,_16,_16>,_0>::index(diagonal,(char *)m,__c);
  variable_if_dynamicindex<long,_0>::variable_if_dynamicindex
            ((variable_if_dynamicindex<long,_0> *)&this->field_0x8,(long)v);
  return;
}

Assistant:

explicit evaluator(const XprType& diagonal)
    : m_argImpl(diagonal.nestedExpression()),
      m_index(diagonal.index())
  { }